

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O1

QStyleOption * __thiscall QStyleOption::operator=(QStyleOption *this,QStyleOption *other)

{
  Representation RVar1;
  Representation RVar2;
  Representation RVar3;
  
  (this->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (other->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i;
  this->direction = other->direction;
  RVar1.m_i = (other->rect).y1.m_i;
  RVar2.m_i = (other->rect).x2.m_i;
  RVar3.m_i = (other->rect).y2.m_i;
  (this->rect).x1 = (Representation)(other->rect).x1.m_i;
  (this->rect).y1 = (Representation)RVar1.m_i;
  (this->rect).x2 = (Representation)RVar2.m_i;
  (this->rect).y2 = (Representation)RVar3.m_i;
  QFontMetrics::operator=(&this->fontMetrics,&other->fontMetrics);
  QPalette::operator=(&this->palette,&other->palette);
  this->styleObject = other->styleObject;
  return this;
}

Assistant:

QStyleOption &QStyleOption::operator=(const QStyleOption &other)
{
    state = other.state;
    direction = other.direction;
    rect = other.rect;
    fontMetrics = other.fontMetrics;
    palette = other.palette;
    styleObject = other.styleObject;
    return *this;
}